

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

Array<asl::InetAddress> __thiscall asl::InetAddress::lookup(InetAddress *this,String *host)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  byte *__dest;
  undefined1 local_90 [8];
  InetAddress a;
  addrinfo *ai;
  int s;
  addrinfo *local_60;
  addrinfo *info;
  addrinfo hints;
  String *host_local;
  Array<asl::InetAddress> *addresses;
  
  Array<asl::InetAddress>::Array((Array<asl::InetAddress> *)this);
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_socktype = 0;
  hints.ai_protocol = 0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  info = (addrinfo *)0x0;
  hints.ai_flags = 0;
  hints.ai_family = 0;
  bVar1 = asl::String::contains(host,':');
  info = (addrinfo *)CONCAT44((uint)bVar1 * 8 + 2,info._0_4_);
  pcVar3 = asl::String::operator_cast_to_char_(host);
  iVar2 = getaddrinfo(pcVar3,(char *)0x0,(addrinfo *)&info,&local_60);
  if (iVar2 == 0) {
    for (a._8_8_ = local_60; a._8_8_ != 0; a._8_8_ = *(undefined8 *)(a._8_8_ + 0x28)) {
      InetAddress((InetAddress *)local_90);
      if (*(int *)(a._8_8_ + 4) == 2) {
        a._data._a._0_4_ = 1;
      }
      else {
        a._data._a._0_4_ = 2;
      }
      resize((InetAddress *)local_90,*(int *)(a._8_8_ + 0x10));
      __dest = ptr((InetAddress *)local_90);
      memcpy(__dest,*(void **)(a._8_8_ + 0x18),(ulong)*(uint *)(a._8_8_ + 0x10));
      bVar1 = Array<asl::InetAddress>::contains
                        ((Array<asl::InetAddress> *)this,(InetAddress *)local_90);
      if (!bVar1) {
        if ((int)a._data._a == 1) {
          Array<asl::InetAddress>::insert((Array<asl::InetAddress> *)this,0,(InetAddress *)local_90)
          ;
        }
        else {
          Array<asl::InetAddress>::operator<<
                    ((Array<asl::InetAddress> *)this,(InetAddress *)local_90);
        }
      }
      ~InetAddress((InetAddress *)local_90);
    }
    freeaddrinfo(local_60);
  }
  else {
    pcVar3 = asl::String::operator*(host);
    verbose_print("Cannot resolve %s\n",pcVar3);
  }
  return (Array<asl::InetAddress>)this;
}

Assistant:

Array<InetAddress> InetAddress::lookup(const String& host)
{
#ifdef _WIN32
	if (!g_wsaStarted) startWSA();
#endif
	Array<InetAddress> addresses;
	addrinfo hints;
	addrinfo* info;
	memset(&hints, 0, sizeof(addrinfo));
	hints.ai_family = host.contains(':') ? AF_INET6 : AF_TYPE;

	int s = getaddrinfo(host, NULL, &hints, &info);
	if (s != 0)
	{
		verbose_print("Cannot resolve %s\n", *host);
		return addresses;
	}
	for (const addrinfo* ai = info; ai; ai = ai->ai_next)
	{
		InetAddress a;
		if (ai->ai_family == AF_INET)
			a._type = IPv4;
		else
			a._type = IPv6;
		a.resize((int)ai->ai_addrlen);
		memcpy(a.ptr(), ai->ai_addr, ai->ai_addrlen);
		if (!addresses.contains(a))
		{
			if (a._type == IPv4)
				addresses.insert(0, a);
			else
				addresses << a;
		}
	}
	freeaddrinfo(info);
	return addresses;
}